

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void duckdb::Prefix::ConcatChildIsGate(ART *art,Node *parent,uint8_t byte,Node *child)

{
  uint8_t byte_local;
  Prefix tail;
  Prefix local_40;
  
  byte_local = byte;
  if (((parent->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
    GetTail(&tail,art,parent);
    Append(&local_40,&tail,art,byte);
    tail.ptr = local_40.ptr;
  }
  else {
    NewInternal(&tail,art,parent,&byte_local,'\x01',0,PREFIX);
  }
  ((tail.ptr)->super_IndexPointer).data = (child->super_IndexPointer).data;
  return;
}

Assistant:

void Prefix::ConcatChildIsGate(ART &art, Node &parent, uint8_t byte, const Node &child) {
	// Create a new prefix and point it to the gate.
	if (parent.GetType() != PREFIX) {
		auto prefix = NewInternal(art, parent, &byte, 1, 0, PREFIX);
		*prefix.ptr = child;
		return;
	}

	auto tail = GetTail(art, parent);
	tail = tail.Append(art, byte);
	*tail.ptr = child;
}